

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::InternalDecompressStringFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  pointer input_type;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_188;
  string local_170;
  ScalarFunction local_150;
  
  StringDecompressFunctionName_abi_cxx11_();
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_170);
  ::std::__cxx11::string::~string((string *)&local_170);
  CMUtils::StringTypes();
  for (input_type = local_188.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      input_type !=
      local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish; input_type = input_type + 1) {
    CMStringDecompressFun::GetFunction(&local_150,input_type);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_150);
    ScalarFunction::~ScalarFunction(&local_150);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_188);
  return in_RDI;
}

Assistant:

ScalarFunctionSet InternalDecompressStringFun::GetFunctions() {
	return GetStringDecompressFunctionSet();
}